

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_mapper.cpp
# Opt level: O2

spv_result_t __thiscall
spvtools::FriendlyNameMapper::ParseInstruction
          (FriendlyNameMapper *this,spv_parsed_instruction_t *inst)

{
  uint16_t uVar1;
  uint uVar2;
  uint32_t *puVar3;
  spv_operand_type_t type;
  iterator iVar4;
  uint32_t uVar5;
  uint32_t n;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t n_02;
  size_type sVar6;
  uint id;
  char *pcVar7;
  __string_type *p_Var8;
  allocator<char> local_251;
  __string_type value_str;
  uint32_t result_id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string local_1e8;
  string local_1c8;
  ostringstream value;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [22];
  
  id = inst->result_id;
  uVar1 = inst->opcode;
  result_id = id;
  switch(uVar1) {
  case 5:
    uVar5 = inst->words[1];
    spvDecodeLiteralStringOperand_abi_cxx11_((string *)&value,inst,1);
    SaveName(this,uVar5,(string *)&value);
    goto LAB_0019fdee;
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x21:
  case 0x27:
  case 0x28:
switchD_0019f712_caseD_6:
    if (id == 0) {
      return SPV_SUCCESS;
    }
    iVar4 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)this,&result_id);
    id = result_id;
    if (iVar4.
        super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      return SPV_SUCCESS;
    }
    to_string_abi_cxx11_((string *)&value,(spvtools *)(ulong)result_id,n);
    goto LAB_0019fcfd;
  case 0x13:
    pcVar7 = "void";
    break;
  case 0x14:
    pcVar7 = "bool";
    break;
  case 0x15:
    _value = (pointer)local_198;
    value_str._M_dataplus._M_p = (pointer)&value_str.field_2;
    value_str._M_string_length = 0;
    local_198[0]._M_local_buf[0] = '\0';
    value_str.field_2._M_local_buf[0] = '\0';
    uVar2 = inst->words[2];
    switch(uVar2 << 0x1d | uVar2 - 8 >> 3) {
    case 0:
      break;
    case 1:
      break;
    default:
      to_string_abi_cxx11_(&local_228,(spvtools *)(ulong)uVar2,(uint32_t)value_str._M_dataplus._M_p)
      ;
      std::__cxx11::string::operator=((string *)&value_str,(string *)&local_228);
      std::__cxx11::string::_M_dispose();
      p_Var8 = (__string_type *)&value;
      goto LAB_0019fd8c;
    case 3:
      break;
    case 7:
    }
    p_Var8 = &value_str;
LAB_0019fd8c:
    std::__cxx11::string::assign((char *)p_Var8);
    if (inst->words[3] == 0) {
      std::__cxx11::string::assign((char *)&value);
    }
    std::operator+(&local_228,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
                   &value_str);
    SaveName(this,id,&local_228);
    goto LAB_0019fddb;
  case 0x16:
    uVar2 = inst->words[2];
    if (uVar2 == 0x40) {
      pcVar7 = "double";
    }
    else if (uVar2 == 0x20) {
      pcVar7 = "float";
    }
    else {
      if (uVar2 != 0x10) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&value_str,"fp",(allocator<char> *)&local_208);
        to_string_abi_cxx11_(&local_228,(spvtools *)(ulong)uVar2,n_02);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
                       &value_str,&local_228);
        SaveName(this,id,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value
                );
        std::__cxx11::string::_M_dispose();
        goto LAB_0019f9a8;
      }
      pcVar7 = "half";
    }
    break;
  case 0x17:
    pcVar7 = "v";
    goto LAB_0019fbea;
  case 0x18:
    pcVar7 = "mat";
LAB_0019fbea:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,pcVar7,(allocator<char> *)&local_1c8);
    to_string_abi_cxx11_(&local_208,(spvtools *)(ulong)inst->words[3],n_01);
    std::operator+(&value_str,&local_228,&local_208);
    NameForId_abi_cxx11_(&local_1e8,this,inst->words[2]);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
                   &value_str,&local_1e8);
    SaveName(this,id,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    goto LAB_0019fdee;
  case 0x1c:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"_arr_",&local_251);
    NameForId_abi_cxx11_(&local_1e8,this,inst->words[2]);
    goto LAB_0019fa3c;
  case 0x1d:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&value_str,"_runtimearr_",(allocator<char> *)&local_208);
    NameForId_abi_cxx11_(&local_228,this,inst->words[2]);
    goto LAB_0019fbb0;
  case 0x1e:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&value_str,"_struct_",(allocator<char> *)&local_208);
    to_string_abi_cxx11_(&local_228,(spvtools *)(ulong)id,n_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
                   &value_str,&local_228);
    SaveName(this,id,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value);
    std::__cxx11::string::_M_dispose();
LAB_0019f9a8:
    std::__cxx11::string::_M_dispose();
    goto LAB_0019fdee;
  case 0x1f:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&value_str,"Opaque_",(allocator<char> *)&local_1e8);
    spvDecodeLiteralStringOperand_abi_cxx11_(&local_208,inst,1);
    Sanitize(&local_228,(FriendlyNameMapper *)inst,&local_208);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
                   &value_str,&local_228);
    SaveName(this,id,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value);
    std::__cxx11::string::_M_dispose();
LAB_0019fddb:
    std::__cxx11::string::_M_dispose();
LAB_0019fde6:
    std::__cxx11::string::_M_dispose();
    goto LAB_0019fdee;
  case 0x20:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"_ptr_",&local_251);
    NameForEnumOperand_abi_cxx11_(&local_1e8,this,SPV_OPERAND_TYPE_STORAGE_CLASS,inst->words[2]);
LAB_0019fa3c:
    std::operator+(&local_228,&local_208,&local_1e8);
    std::operator+(&value_str,&local_228,"_");
    NameForId_abi_cxx11_(&local_1c8,this,inst->words[3]);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
                   &value_str,&local_1c8);
    SaveName(this,id,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    goto LAB_0019fdee;
  case 0x22:
    pcVar7 = "Event";
    break;
  case 0x23:
    pcVar7 = "DeviceEvent";
    break;
  case 0x24:
    pcVar7 = "ReserveId";
    break;
  case 0x25:
    pcVar7 = "Queue";
    break;
  case 0x26:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&value_str,"Pipe",(allocator<char> *)&local_208);
    uVar5 = inst->words[2];
    type = SPV_OPERAND_TYPE_ACCESS_QUALIFIER;
LAB_0019f9e4:
    NameForEnumOperand_abi_cxx11_(&local_228,this,type,uVar5);
LAB_0019fbb0:
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
                   &value_str,&local_228);
    SaveName(this,id,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value);
    std::__cxx11::string::_M_dispose();
    goto LAB_0019fde6;
  case 0x29:
    pcVar7 = "true";
    break;
  case 0x2a:
    pcVar7 = "false";
    break;
  case 0x2b:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&value);
    EmitNumericLiteral((ostream *)&value,inst,inst->operands + 2);
    std::__cxx11::stringbuf::str();
    for (sVar6 = 0; value_str._M_string_length != sVar6; sVar6 = sVar6 + 1) {
      if (value_str._M_dataplus._M_p[sVar6] == '-') {
        value_str._M_dataplus._M_p[sVar6] = 'n';
      }
    }
    NameForId_abi_cxx11_(&local_1e8,this,inst->type_id);
    std::operator+(&local_208,&local_1e8,"_");
    std::operator+(&local_228,&local_208,&value_str);
    SaveName(this,id,&local_228);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&value);
    return SPV_SUCCESS;
  default:
    if (uVar1 == 0x47) {
      puVar3 = inst->words;
      if (puVar3[2] != 0xb) {
        return SPV_SUCCESS;
      }
      if (3 < inst->num_words) {
        SaveBuiltInName(this,puVar3[1],puVar3[3]);
        return SPV_SUCCESS;
      }
      __assert_fail("inst.num_words > 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/name_mapper.cpp"
                    ,0xaf,
                    "spv_result_t spvtools::FriendlyNameMapper::ParseInstruction(const spv_parsed_instruction_t &)"
                   );
    }
    if (uVar1 == 0x142) {
      pcVar7 = "PipeStorage";
    }
    else {
      if (uVar1 != 0x147) {
        if (uVar1 == 0x1141) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&value_str,"_ptr_",(allocator<char> *)&local_208);
          uVar5 = inst->words[2];
          type = SPV_OPERAND_TYPE_STORAGE_CLASS;
          goto LAB_0019f9e4;
        }
        goto switchD_0019f712_caseD_6;
      }
      pcVar7 = "NamedBarrier";
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&value,pcVar7,(allocator<char> *)&value_str);
LAB_0019fcfd:
  SaveName(this,id,(string *)&value);
LAB_0019fdee:
  std::__cxx11::string::_M_dispose();
  return SPV_SUCCESS;
}

Assistant:

spv_result_t FriendlyNameMapper::ParseInstruction(
    const spv_parsed_instruction_t& inst) {
  const auto result_id = inst.result_id;
  switch (spv::Op(inst.opcode)) {
    case spv::Op::OpName:
      SaveName(inst.words[1], spvDecodeLiteralStringOperand(inst, 1));
      break;
    case spv::Op::OpDecorate:
      // Decorations come after OpName.  So OpName will take precedence over
      // decorations.
      //
      // In theory, we should also handle OpGroupDecorate.  But that's unlikely
      // to occur.
      if (spv::Decoration(inst.words[2]) == spv::Decoration::BuiltIn) {
        assert(inst.num_words > 3);
        SaveBuiltInName(inst.words[1], inst.words[3]);
      }
      break;
    case spv::Op::OpTypeVoid:
      SaveName(result_id, "void");
      break;
    case spv::Op::OpTypeBool:
      SaveName(result_id, "bool");
      break;
    case spv::Op::OpTypeInt: {
      std::string signedness;
      std::string root;
      const auto bit_width = inst.words[2];
      switch (bit_width) {
        case 8:
          root = "char";
          break;
        case 16:
          root = "short";
          break;
        case 32:
          root = "int";
          break;
        case 64:
          root = "long";
          break;
        default:
          root = to_string(bit_width);
          signedness = "i";
          break;
      }
      if (0 == inst.words[3]) signedness = "u";
      SaveName(result_id, signedness + root);
    } break;
    case spv::Op::OpTypeFloat: {
      const auto bit_width = inst.words[2];
      // TODO: Handle optional fpencoding enum once actually used.
      switch (bit_width) {
        case 16:
          SaveName(result_id, "half");
          break;
        case 32:
          SaveName(result_id, "float");
          break;
        case 64:
          SaveName(result_id, "double");
          break;
        default:
          SaveName(result_id, std::string("fp") + to_string(bit_width));
          break;
      }
    } break;
    case spv::Op::OpTypeVector:
      SaveName(result_id, std::string("v") + to_string(inst.words[3]) +
                              NameForId(inst.words[2]));
      break;
    case spv::Op::OpTypeMatrix:
      SaveName(result_id, std::string("mat") + to_string(inst.words[3]) +
                              NameForId(inst.words[2]));
      break;
    case spv::Op::OpTypeArray:
      SaveName(result_id, std::string("_arr_") + NameForId(inst.words[2]) +
                              "_" + NameForId(inst.words[3]));
      break;
    case spv::Op::OpTypeRuntimeArray:
      SaveName(result_id,
               std::string("_runtimearr_") + NameForId(inst.words[2]));
      break;
    case spv::Op::OpTypePointer:
      SaveName(result_id, std::string("_ptr_") +
                              NameForEnumOperand(SPV_OPERAND_TYPE_STORAGE_CLASS,
                                                 inst.words[2]) +
                              "_" + NameForId(inst.words[3]));
      break;
    case spv::Op::OpTypeUntypedPointerKHR:
      SaveName(result_id, std::string("_ptr_") +
                              NameForEnumOperand(SPV_OPERAND_TYPE_STORAGE_CLASS,
                                                 inst.words[2]));
      break;
    case spv::Op::OpTypePipe:
      SaveName(result_id,
               std::string("Pipe") +
                   NameForEnumOperand(SPV_OPERAND_TYPE_ACCESS_QUALIFIER,
                                      inst.words[2]));
      break;
    case spv::Op::OpTypeEvent:
      SaveName(result_id, "Event");
      break;
    case spv::Op::OpTypeDeviceEvent:
      SaveName(result_id, "DeviceEvent");
      break;
    case spv::Op::OpTypeReserveId:
      SaveName(result_id, "ReserveId");
      break;
    case spv::Op::OpTypeQueue:
      SaveName(result_id, "Queue");
      break;
    case spv::Op::OpTypeOpaque:
      SaveName(result_id, std::string("Opaque_") +
                              Sanitize(spvDecodeLiteralStringOperand(inst, 1)));
      break;
    case spv::Op::OpTypePipeStorage:
      SaveName(result_id, "PipeStorage");
      break;
    case spv::Op::OpTypeNamedBarrier:
      SaveName(result_id, "NamedBarrier");
      break;
    case spv::Op::OpTypeStruct:
      // Structs are mapped rather simplisitically. Just indicate that they
      // are a struct and then give the raw Id number.
      SaveName(result_id, std::string("_struct_") + to_string(result_id));
      break;
    case spv::Op::OpConstantTrue:
      SaveName(result_id, "true");
      break;
    case spv::Op::OpConstantFalse:
      SaveName(result_id, "false");
      break;
    case spv::Op::OpConstant: {
      std::ostringstream value;
      EmitNumericLiteral(&value, inst, inst.operands[2]);
      auto value_str = value.str();
      // Use 'n' to signify negative. Other invalid characters will be mapped
      // to underscore.
      for (auto& c : value_str)
        if (c == '-') c = 'n';
      SaveName(result_id, NameForId(inst.type_id) + "_" + value_str);
    } break;
    default:
      // If this instruction otherwise defines an Id, then save a mapping for
      // it.  This is needed to ensure uniqueness in there is an OpName with
      // string something like "1" that might collide with this result_id.
      // We should only do this if a name hasn't already been registered by some
      // previous forward reference.
      if (result_id && name_for_id_.find(result_id) == name_for_id_.end())
        SaveName(result_id, to_string(result_id));
      break;
  }
  return SPV_SUCCESS;
}